

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                  *this,dense_hashtable<std::pair<const_A,_int>,_A,_HashA,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SelectKey,_google::dense_hash_map<A,_int,_HashA,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>::SetKey,_std::equal_to<A>,_google::libc_allocator_with_realloc<std::pair<const_A,_int>_>_>
                        *ht,size_type min_buckets_wanted)

{
  size_type sVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  ulong uVar7;
  size_type sVar8;
  float fVar9;
  
  sVar8 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_threshold_;
  sVar1 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_threshold_;
  fVar9 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_factor_;
  bVar2 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_;
  bVar3 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_empty_;
  bVar4 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_deleted_;
  uVar5 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.field_0x1b;
  uVar6 = (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.num_ht_copies_;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_factor_ =
       (ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_factor_;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_factor_ = fVar9;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_ = bVar2;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_empty_ = bVar3;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_deleted_ = bVar4;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.field_0x1b = uVar5;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.num_ht_copies_ = uVar6;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_threshold_ =
       sVar8;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_threshold_ = sVar1
  ;
  (this->key_info).delkey._i = 0;
  (this->key_info).delkey._i = (ht->key_info).delkey._i;
  (this->key_info).empty_key._i = 0;
  (this->key_info).empty_key._i = (ht->key_info).empty_key._i;
  A::copy_ctor = A::copy_ctor + 2;
  this->table = (pointer)0x0;
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = 0;
  if ((ht->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.use_empty_ != false) {
    fVar9 = (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_factor_
            * 0.0;
    uVar7 = (ulong)fVar9;
    (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_threshold_ =
         (long)(fVar9 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
    fVar9 = (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_factor_
            * 0.0;
    uVar7 = (ulong)fVar9;
    (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_threshold_ =
         (long)(fVar9 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
    (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_ =
         false;
    dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>>
              ((dense_hashtable<std::pair<A_const,int>,A,HashA,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SelectKey,google::dense_hash_map<A,int,HashA,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>::SetKey,std::equal_to<A>,google::libc_allocator_with_realloc<std::pair<A_const,int>>>
                *)this,ht,min_buckets_wanted);
    return;
  }
  sVar8 = sparsehash_internal::sh_hashtable_settings<A,_HashA,_unsigned_long,_4>::min_buckets
                    ((sh_hashtable_settings<A,_HashA,_unsigned_long,_4> *)this,
                     ht->num_elements - ht->num_deleted,min_buckets_wanted);
  this->num_buckets = sVar8;
  fVar9 = (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_factor_ *
          (float)sVar8;
  uVar7 = (ulong)fVar9;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.enlarge_threshold_ =
       (long)(fVar9 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
  fVar9 = (float)sVar8 *
          (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_factor_;
  uVar7 = (ulong)fVar9;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.shrink_threshold_ =
       (long)(fVar9 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7;
  (this->settings).super_sh_hashtable_settings<A,_HashA,_unsigned_long,_4>.consider_shrink_ = false;
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }